

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O2

Gia_Man_t * Gia_ManSpeedup(Gia_Man_t *p,int Percentage,int Degree,int fVerbose,int fVeryVerbose)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  Tim_Man_t *pTVar5;
  void *pvVar6;
  int *piVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *p_00;
  Gia_Rpr_t *pGVar9;
  ulong uVar10;
  Vec_Int_t *p_01;
  Vec_Int_t *vLeaves;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  int Id;
  char *pcVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  size_t __nmemb;
  float fVar17;
  float fVar18;
  double dVar19;
  float tDelta;
  ulong local_70;
  uint local_60;
  uint local_58;
  Tim_Man_t *local_50;
  
  if (p->vMapping == (Vec_Int_t *)0x0) {
    __assert_fail("Gia_ManHasMapping(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSpeedup.c"
                  ,0x27f,"Gia_Man_t *Gia_ManSpeedup(Gia_Man_t *, int, int, int, int)");
  }
  pvVar6 = p->pLutLib;
  if ((pvVar6 == (void *)0x0) && (local_50 = (Tim_Man_t *)p->pManTime, local_50 != (Tim_Man_t *)0x0)
     ) {
    pTVar5 = Tim_ManDup(local_50,1);
    p->pManTime = pTVar5;
  }
  else {
    local_50 = (Tim_Man_t *)0x0;
  }
  fVar17 = Gia_ManDelayTraceLut(p);
  if (pvVar6 == (void *)0x0) {
    tDelta = 1.0;
  }
  else {
    tDelta = ((float)Percentage * fVar17) / 100.0;
  }
  if (fVerbose != 0) {
    printf("Max delay = %.2f. Delta = %.2f. ",(double)fVar17,(double)tDelta);
    pcVar13 = "LUT library";
    if (pvVar6 == (void *)0x0) {
      pcVar13 = "unit-delay";
    }
    printf("Using %s model. ",pcVar13);
    if (pvVar6 != (void *)0x0) {
      printf("Percentage = %d. ",Percentage);
    }
    putchar(10);
  }
  iVar1 = p->nObjs;
  pvVar6 = calloc((long)iVar1,4);
  for (lVar15 = 1; iVar3 = (int)lVar15, lVar15 < iVar1; lVar15 = lVar15 + 1) {
    iVar1 = Gia_ObjIsLut(p,iVar3);
    if ((iVar1 != 0) && (fVar17 = Gia_ObjTimeSlack(p,iVar3), fVar17 < tDelta)) {
      uVar2 = Gia_LutDelayTraceTCEdges(p,iVar3,tDelta);
      *(uint *)((long)pvVar6 + lVar15 * 4) = uVar2;
    }
    iVar1 = p->nObjs;
  }
  if (fVerbose != 0) {
    local_70 = 0;
    uVar2 = 0;
    for (lVar15 = 1; lVar15 < iVar1; lVar15 = lVar15 + 1) {
      iVar3 = (int)lVar15;
      iVar1 = Gia_ObjIsLut(p,iVar3);
      if (iVar1 != 0) {
        for (lVar16 = 0; iVar1 = Gia_ObjLutSize(p,iVar3), lVar16 < iVar1; lVar16 = lVar16 + 1) {
          piVar7 = Gia_ObjLutFanins(p,iVar3);
          iVar1 = piVar7[lVar16];
          pGVar8 = Gia_ManObj(p,iVar1);
          if ((((undefined1  [12])*pGVar8 & (undefined1  [12])0x9fffffff) !=
               (undefined1  [12])0x9fffffff) &&
             (fVar17 = Gia_ObjTimeSlack(p,iVar1), fVar17 < tDelta)) {
            local_70 = (ulong)((int)local_70 + 1);
          }
        }
        uVar14 = *(uint *)((long)pvVar6 + lVar15 * 4);
        uVar14 = (uVar14 >> 1 & 0x55555555) + (uVar14 & 0x55555555);
        uVar14 = (uVar14 >> 2 & 0x33333333) + (uVar14 & 0x33333333);
        uVar14 = (uVar14 >> 4 & 0x7070707) + (uVar14 & 0x7070707);
        uVar14 = (uVar14 >> 8 & 0xf000f) + (uVar14 & 0xf000f);
        uVar2 = (uVar14 >> 0x10) + uVar2 + (uVar14 & 0xffff);
      }
      iVar1 = p->nObjs;
    }
    uVar14 = Gia_ManLutFaninCount(p);
    dVar19 = 0.0;
    if ((int)local_70 != 0) {
      dVar19 = (double)(int)uVar2 / (double)(int)local_70;
    }
    printf("Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n",dVar19,(ulong)uVar14
           ,local_70,(ulong)uVar2);
  }
  p_00 = Gia_ManDup(p);
  Gia_ManHashStart(p_00);
  iVar1 = p_00->nObjs;
  __nmemb = (long)iVar1 * 3 + 1000;
  piVar7 = (int *)calloc(__nmemb,4);
  p_00->pNexts = piVar7;
  pGVar9 = (Gia_Rpr_t *)calloc(__nmemb,4);
  p_00->pReprs = pGVar9;
  uVar10 = 0;
  uVar12 = 0;
  if (0 < (int)__nmemb) {
    uVar12 = __nmemb & 0xffffffff;
  }
  for (; uVar12 != uVar10; uVar10 = uVar10 + 1) {
    p_00->pReprs[uVar10] = (Gia_Rpr_t)((uint)p_00->pReprs[uVar10] | 0xfffffff);
  }
  p_01 = Vec_IntAlloc(0x10);
  vLeaves = Vec_IntAlloc(0x10);
  uVar10 = 1;
  local_58 = 0;
  local_60 = 0;
  do {
    if ((long)p->nObjs <= (long)uVar10) {
LAB_002075c3:
      Gia_ManTimeStop(p);
      Vec_IntFree(p_01);
      Vec_IntFree(vLeaves);
      free(pvVar6);
      if (fVerbose != 0) {
        uVar2 = Gia_ManLutNum(p);
        dVar19 = 0.0;
        if (local_58 != 0) {
          dVar19 = (double)(int)local_60 / (double)(int)local_58;
        }
        printf("Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n",dVar19,
               (ulong)uVar2,(ulong)local_58,(ulong)local_60);
      }
      if (local_50 != (Tim_Man_t *)0x0) {
        Tim_ManStop((Tim_Man_t *)p->pManTime);
        p->pManTime = local_50;
      }
      pGVar11 = Gia_ManEquivToChoices(p_00,1);
      Gia_ManStop(p_00);
      return pGVar11;
    }
    Id = (int)uVar10;
    iVar3 = Gia_ObjIsLut(p,Id);
    if ((iVar3 != 0) && (fVar17 = Gia_ObjTimeSlack(p,Id), fVar17 < tDelta)) {
      lVar15 = 0;
      uVar12 = 0;
      while( true ) {
        iVar3 = Gia_ObjLutSize(p,Id);
        iVar4 = (int)uVar12;
        if (iVar3 <= lVar15) break;
        piVar7 = Gia_ObjLutFanins(p,Id);
        pGVar8 = Gia_ManObj(p,piVar7[lVar15]);
        if (((undefined1  [12])*pGVar8 & (undefined1  [12])0x9fffffff) !=
            (undefined1  [12])0x9fffffff) {
          uVar12 = (ulong)(iVar4 + (uint)((*(uint *)((long)pvVar6 + uVar10 * 4) >>
                                           ((uint)lVar15 & 0x1f) & 1) != 0));
        }
        lVar15 = lVar15 + 1;
      }
      if (fVeryVerbose != 0 || iVar4 != 0) {
        local_58 = local_58 + 1;
        p_01->nSize = 0;
        if (iVar4 != 0) {
          for (lVar15 = 0; iVar3 = Gia_ObjLutSize(p,Id), lVar15 < iVar3; lVar15 = lVar15 + 1) {
            piVar7 = Gia_ObjLutFanins(p,Id);
            iVar3 = piVar7[lVar15];
            pGVar8 = Gia_ManObj(p,iVar3);
            if ((((undefined1  [12])*pGVar8 & (undefined1  [12])0x9fffffff) !=
                 (undefined1  [12])0x9fffffff) &&
               ((*(uint *)((long)pvVar6 + uVar10 * 4) >> ((uint)lVar15 & 0x1f) & 1) != 0)) {
              for (lVar16 = 0; iVar4 = Gia_ObjLutSize(p,iVar3), lVar16 < iVar4; lVar16 = lVar16 + 1)
              {
                piVar7 = Gia_ObjLutFanins(p,iVar3);
                if ((*(uint *)((long)pvVar6 + (long)iVar3 * 4) >> ((uint)lVar16 & 0x1f) & 1) != 0) {
                  Vec_IntPushUnique(p_01,piVar7[lVar16]);
                }
              }
            }
          }
          uVar2 = p_01->nSize;
          if ((int)uVar2 <= Degree && uVar2 != 0) {
            vLeaves->nSize = 0;
            for (lVar15 = 0; iVar3 = Gia_ObjLutSize(p,Id), lVar15 < iVar3; lVar15 = lVar15 + 1) {
              piVar7 = Gia_ObjLutFanins(p,Id);
              iVar3 = piVar7[lVar15];
              pGVar8 = Gia_ManObj(p,iVar3);
              if (((undefined1  [12])*pGVar8 & (undefined1  [12])0x9fffffff) ==
                  (undefined1  [12])0x9fffffff) {
                Vec_IntPushUnique(vLeaves,iVar3);
              }
              else {
                for (lVar16 = 0; iVar4 = Gia_ObjLutSize(p,iVar3), lVar16 < iVar4;
                    lVar16 = lVar16 + 1) {
                  piVar7 = Gia_ObjLutFanins(p,iVar3);
                  Vec_IntPushUnique(vLeaves,piVar7[lVar16]);
                }
              }
            }
            if (fVeryVerbose != 0) {
              printf("%5d Node %5d : %d %2d %2d  ",(ulong)local_58,uVar10 & 0xffffffff,uVar12,
                     (ulong)uVar2,(ulong)(uint)vLeaves->nSize);
              for (lVar15 = 0; iVar3 = Gia_ObjLutSize(p,Id), lVar15 < iVar3; lVar15 = lVar15 + 1) {
                piVar7 = Gia_ObjLutFanins(p,Id);
                uVar14 = piVar7[lVar15];
                fVar17 = Gia_ObjTimeSlack(p,uVar14);
                pcVar13 = "*";
                if ((*(uint *)((long)pvVar6 + uVar10 * 4) >> ((uint)lVar15 & 0x1f) & 1) == 0) {
                  pcVar13 = "";
                }
                printf("%d(%.2f)%s ",(double)fVar17,(ulong)uVar14,pcVar13);
              }
              putchar(10);
            }
            if (1 < (int)uVar2) {
              iVar3 = Vec_IntEntry(p_01,0);
              iVar4 = Vec_IntEntry(p_01,1);
              fVar17 = Gia_ObjTimeSlack(p,iVar3);
              fVar18 = Gia_ObjTimeSlack(p,iVar4);
              if (fVar17 < fVar18) {
                Vec_IntWriteEntry(p_01,0,iVar4);
                Vec_IntWriteEntry(p_01,1,iVar3);
              }
              if (uVar2 != 2) {
                iVar3 = Vec_IntEntry(p_01,1);
                iVar4 = Vec_IntEntry(p_01,2);
                fVar17 = Gia_ObjTimeSlack(p,iVar3);
                fVar18 = Gia_ObjTimeSlack(p,iVar4);
                if (fVar17 < fVar18) {
                  Vec_IntWriteEntry(p_01,1,iVar4);
                  Vec_IntWriteEntry(p_01,2,iVar3);
                }
                iVar3 = Vec_IntEntry(p_01,0);
                iVar4 = Vec_IntEntry(p_01,1);
                fVar17 = Gia_ObjTimeSlack(p,iVar3);
                fVar18 = Gia_ObjTimeSlack(p,iVar4);
                if (fVar17 < fVar18) {
                  Vec_IntWriteEntry(p_01,0,iVar4);
                  Vec_IntWriteEntry(p_01,1,iVar3);
                }
              }
            }
            local_60 = local_60 + 1;
            pGVar8 = Gia_ManObj(p,Id);
            Gia_ManSpeedupObj(p_00,p,pGVar8,vLeaves,p_01);
            if (iVar1 * 3 + 900 < p_00->nObjs) {
              puts("Speedup stopped adding choices because there was too many to add.");
              goto LAB_002075c3;
            }
          }
        }
      }
    }
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManSpeedup( Gia_Man_t * p, int Percentage, int Degree, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew, * pTemp;
    Vec_Int_t * vTimeCries, * vTimeFanins;
    int iObj, iFanin, iFanin2, nNodesNew;
    float tDelta, tArrival;
    int i, k, k2, Counter, CounterRes, nTimeCris;
    int fUseLutLib = (p->pLutLib != NULL);
    void * pTempTim = NULL;
    unsigned * puTCEdges;
    assert( Gia_ManHasMapping(p) );
    if ( !fUseLutLib && p->pManTime )
    {
        pTempTim = p->pManTime;
        p->pManTime = Tim_ManDup( (Tim_Man_t *)pTempTim, 1 );
    }
    // perform delay trace
    tArrival = Gia_ManDelayTraceLut( p );
    tDelta = fUseLutLib ? tArrival*Percentage/100.0 : 1.0;
    if ( fVerbose )
    {
        printf( "Max delay = %.2f. Delta = %.2f. ", tArrival, tDelta );
        printf( "Using %s model. ", fUseLutLib ? "LUT library" : "unit-delay" );
        if ( fUseLutLib )
            printf( "Percentage = %d. ", Percentage );
        printf( "\n" );
    }
    // mark the timing critical nodes and edges
    puTCEdges = ABC_CALLOC( unsigned, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, iObj )
    {
        if ( Gia_ObjTimeSlack(p, iObj) >= tDelta )
            continue;
        puTCEdges[iObj] = Gia_LutDelayTraceTCEdges( p, iObj, tDelta );
    }
    if ( fVerbose )
    {
        Counter = CounterRes = 0;
        Gia_ManForEachLut( p, iObj )
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && Gia_ObjTimeSlack(p, iFanin) < tDelta )
                    Counter++;
            CounterRes += Gia_WordCountOnes( puTCEdges[iObj] );
        }
        printf( "Edges: Total = %7d. 0-slack = %7d. Critical = %7d. Ratio = %4.2f\n", 
            Gia_ManLutFaninCount(p), Counter, CounterRes, Counter? 1.0*CounterRes/Counter : 0.0 );
    }

    // start the resulting network
    pNew = Gia_ManDup( p );
    Gia_ManHashStart( pNew );
    nNodesNew = 1000 + 3 * Gia_ManObjNum(pNew);
    pNew->pNexts = ABC_CALLOC( int, nNodesNew );
    pNew->pReprs = ABC_CALLOC( Gia_Rpr_t, nNodesNew );
    for ( i = 0; i < nNodesNew; i++ )
        Gia_ObjSetRepr( pNew, i, GIA_VOID );

    // collect nodes to be used for resynthesis
    Counter = CounterRes = 0;
    vTimeCries = Vec_IntAlloc( 16 );
    vTimeFanins = Vec_IntAlloc( 16 );
    Gia_ManForEachLut( p, iObj )
    {
        if ( Gia_ObjTimeSlack(p, iObj) >= tDelta )
            continue;
        // count the number of non-PI timing-critical nodes
        nTimeCris = 0;
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && (puTCEdges[iObj] & (1<<k)) )
                nTimeCris++;
        if ( !fVeryVerbose && nTimeCris == 0 )
            continue;
        Counter++;
        // count the total number of timing critical second-generation nodes
        Vec_IntClear( vTimeCries );
        if ( nTimeCris )
        {
            Gia_LutForEachFanin( p, iObj, iFanin, k )
                if ( !Gia_ObjIsCi(Gia_ManObj(p, iFanin)) && (puTCEdges[iObj] & (1<<k)) )
                    Gia_LutForEachFanin( p, iFanin, iFanin2, k2 )
                        if ( puTCEdges[iFanin] & (1<<k2) )
                            Vec_IntPushUnique( vTimeCries, iFanin2 );
        }
//        if ( !fVeryVerbose && (Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree) )
        if ( (Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree) )
            continue;
        CounterRes++;
        // collect second generation nodes
        Vec_IntClear( vTimeFanins );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
        {
            if ( Gia_ObjIsCi(Gia_ManObj(p, iFanin)) )
                Vec_IntPushUnique( vTimeFanins, iFanin );
            else
                Gia_LutForEachFanin( p, iFanin, iFanin2, k2 )
                    Vec_IntPushUnique( vTimeFanins, iFanin2 );                    
        }
        // print the results
        if ( fVeryVerbose )
        {
        printf( "%5d Node %5d : %d %2d %2d  ", Counter, iObj, 
            nTimeCris, Vec_IntSize(vTimeCries), Vec_IntSize(vTimeFanins) );
        Gia_LutForEachFanin( p, iObj, iFanin, k )
            printf( "%d(%.2f)%s ", iFanin, Gia_ObjTimeSlack(p, iFanin), (puTCEdges[iObj] & (1<<k))? "*":"" );
        printf( "\n" );
        }
        // add the node to choices
        if ( Vec_IntSize(vTimeCries) == 0 || Vec_IntSize(vTimeCries) > Degree )
            continue;
        // order the fanins in the increasing order of criticalily
        if ( Vec_IntSize(vTimeCries) > 1 )
        {
            iFanin = Vec_IntEntry( vTimeCries, 0 );
            iFanin2 = Vec_IntEntry( vTimeCries, 1 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 0, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 1, iFanin );
            }
        }
        if ( Vec_IntSize(vTimeCries) > 2 )
        {
            iFanin = Vec_IntEntry( vTimeCries, 1 );
            iFanin2 = Vec_IntEntry( vTimeCries, 2 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 1, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 2, iFanin );
            }
            iFanin = Vec_IntEntry( vTimeCries, 0 );
            iFanin2 = Vec_IntEntry( vTimeCries, 1 );
            if ( Gia_ObjTimeSlack(p, iFanin) < Gia_ObjTimeSlack(p, iFanin2) )
            {
                Vec_IntWriteEntry( vTimeCries, 0, iFanin2 );
                Vec_IntWriteEntry( vTimeCries, 1, iFanin );
            }
        }
        // add choice
        Gia_ManSpeedupObj( pNew, p, Gia_ManObj(p,iObj), vTimeFanins, vTimeCries );
        // quit if the number of nodes is large
        if ( Gia_ManObjNum(pNew) > nNodesNew - 100 )
        {
            printf( "Speedup stopped adding choices because there was too many to add.\n" );
            break;
        }
    }
    Gia_ManTimeStop( p );
    Vec_IntFree( vTimeCries );
    Vec_IntFree( vTimeFanins );
    ABC_FREE( puTCEdges );
    if ( fVerbose )
        printf( "Nodes: Total = %7d. 0-slack = %7d. Workable = %7d. Ratio = %4.2f\n", 
        Gia_ManLutNum(p), Counter, CounterRes, Counter? 1.0*CounterRes/Counter : 0.0 ); 
    if ( pTempTim )
    {
        Tim_ManStop( (Tim_Man_t *)p->pManTime );
        p->pManTime = pTempTim;
    }
    // derive AIG with choices
//Gia_ManPrintStats( pNew, 0 );
    pTemp = Gia_ManEquivToChoices( pNew, 1 );
    Gia_ManStop( pNew );
//Gia_ManPrintStats( pTemp, 0 );
//    pNew = Gia_ManDupOrderDfsChoices( pTemp );
//    Gia_ManStop( pTemp );
//Gia_ManPrintStats( pNew, 0 );
//    return pNew;
    return pTemp;
}